

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

Error uv11::timer_start(Timer *timer,Callback *callback,uint64_t timeout,uint64_t repeat)

{
  uv_timer_s *puVar1;
  _func_void_uv_timer_t_ptr *p_Var2;
  error_code eVar3;
  Error EVar4;
  __0 local_3d;
  int local_3c;
  uint64_t uStack_38;
  int s;
  uint64_t repeat_local;
  uint64_t timeout_local;
  Callback *callback_local;
  Timer *timer_local;
  
  uStack_38 = repeat;
  repeat_local = timeout;
  timeout_local = (uint64_t)callback;
  callback_local = (Callback *)timer;
  std::function<void_(uv11::Timer_&)>::operator=(&timer->callback,callback);
  puVar1 = WrappedObject<uv_timer_s>::Get
                     ((WrappedObject<uv_timer_s> *)&callback_local[2]._M_invoker);
  p_Var2 = timer_start(uv11::Timer&,std::function_const&,unsigned_long,unsigned_long)::$_0::
           operator_cast_to_function_pointer(&local_3d);
  local_3c = uv_timer_start(puVar1,p_Var2,repeat_local,uStack_38);
  eVar3 = make_error(local_3c);
  EVar4._M_cat = eVar3._M_cat;
  EVar4._M_value = eVar3._M_value;
  EVar4._4_4_ = 0;
  return EVar4;
}

Assistant:

Error uv11::timer_start(Timer& timer, Timer::Callback const& callback, uint64_t timeout, uint64_t repeat) {
    timer.callback = callback;

    int s = ::uv_timer_start(
        &timer.Get(),
        [] (uv_timer_t* t) {
            Timer* ptr = reinterpret_cast<Timer*>(t->data);
            auto c = ptr->callback;
            c(*ptr);
        },
        timeout, repeat
    );

    return make_error(s);
}